

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

PropertyDeclarationSyntax * __thiscall
slang::parsing::Parser::parsePropertyDeclaration(Parser *this,AttrList attributes)

{
  Token semi_00;
  Token optionalSemi;
  Token end_00;
  span<slang::syntax::LocalVariableDeclarationSyntax_*,_18446744073709551615UL> elements;
  Token name_00;
  Token keyword_00;
  bool bVar1;
  int iVar2;
  AssertionItemPortListSyntax *portList_00;
  PropertySpecSyntax *propertySpec;
  undefined4 extraout_var;
  PropertyDeclarationSyntax *pPVar3;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Token TVar4;
  Token TVar5;
  Token TVar6;
  Token TVar7;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> local_198;
  char local_168 [8];
  Info *pIStack_160;
  AssertionItemPortListSyntax *local_158;
  Info *pIStack_150;
  Info *local_148;
  Info *pIStack_140;
  pointer local_138;
  size_type sStack_130;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_128;
  AssertionItemPortListSyntax *local_f8;
  Token TStack_f0;
  NamedBlockClauseSyntax *local_e0;
  NamedBlockClauseSyntax *blockName;
  Token end;
  Token optSemi;
  PropertySpecSyntax *spec;
  undefined1 local_98 [8];
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> declarations;
  Token semi;
  AssertionItemPortListSyntax *portList;
  Token name;
  Token keyword;
  Parser *this_local;
  AttrList attributes_local;
  
  TVar4 = ParserBase::consume(&this->super_ParserBase);
  TVar5 = ParserBase::expect(&this->super_ParserBase,Identifier);
  portList_00 = parseAssertionItemPortList(this,PropertyDeclaration);
  join_0x00000010_0x00000000_ = ParserBase::expect(&this->super_ParserBase,Semicolon);
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> *)local_98);
  while( true ) {
    bVar1 = isLocalVariableDeclaration(this);
    if (!bVar1) break;
    spec = (PropertySpecSyntax *)parseLocalVariableDeclaration(this);
    SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)local_98,
               (LocalVariableDeclarationSyntax **)&spec);
  }
  propertySpec = parsePropertySpec(this);
  TVar6 = ParserBase::consumeIf(&this->super_ParserBase,Semicolon);
  end.info = TVar6._0_8_;
  TVar7 = ParserBase::expect(&this->super_ParserBase,EndPropertyKeyword);
  end._0_8_ = TVar7.info;
  blockName = TVar7._0_8_;
  local_e0 = parseNamedBlockClause(this);
  portList = TVar5._0_8_;
  name._0_8_ = TVar5.info;
  local_f8 = portList;
  TStack_f0.kind = name.kind;
  TStack_f0._2_1_ = name._2_1_;
  TStack_f0.numFlags.raw = name.numFlags.raw;
  TStack_f0.rawLen = name.rawLen;
  checkBlockNames(this,TVar5,local_e0);
  local_138 = attributes.data_;
  sStack_130 = attributes.size_;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_128,attributes);
  TVar5 = stack0xffffffffffffffa8;
  name.info = TVar4._0_8_;
  keyword._0_8_ = TVar4.info;
  local_148 = name.info;
  pIStack_140 = (Info *)keyword._0_8_;
  local_158 = portList;
  pIStack_150 = (Info *)name._0_8_;
  local_168[0] = declarations.stackBase[0x18];
  local_168[1] = declarations.stackBase[0x19];
  local_168[2] = declarations.stackBase[0x1a];
  local_168[3] = declarations.stackBase[0x1b];
  local_168[4] = declarations.stackBase[0x1c];
  local_168[5] = declarations.stackBase[0x1d];
  local_168[6] = declarations.stackBase[0x1e];
  local_168[7] = declarations.stackBase[0x1f];
  pIStack_160 = (Info *)semi._0_8_;
  unique0x100005ba = TVar5;
  iVar2 = SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::LocalVariableDeclarationSyntax_*> *)local_98,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  elements.data_._4_4_ = extraout_var;
  elements.data_._0_4_ = iVar2;
  elements.size_ = extraout_RDX;
  slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>::SyntaxList
            (&local_198,elements);
  keyword_00.info = pIStack_140;
  keyword_00._0_8_ = local_148;
  name_00.info = pIStack_150;
  name_00._0_8_ = local_158;
  semi_00.info = pIStack_160;
  semi_00._0_8_ = local_168;
  optionalSemi.info = TVar6.info;
  optionalSemi._0_8_ = end.info;
  end_00.info = (Info *)end._0_8_;
  end_00._0_8_ = blockName;
  pPVar3 = slang::syntax::SyntaxFactory::propertyDeclaration
                     (&this->factory,&local_128,keyword_00,name_00,portList_00,semi_00,&local_198,
                      propertySpec,optionalSemi,end_00,local_e0);
  SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::LocalVariableDeclarationSyntax_*,_5UL> *)local_98);
  return pPVar3;
}

Assistant:

PropertyDeclarationSyntax& Parser::parsePropertyDeclaration(AttrList attributes) {
    auto keyword = consume();
    auto name = expect(TokenKind::Identifier);
    auto portList = parseAssertionItemPortList(SyntaxKind::PropertyDeclaration);
    auto semi = expect(TokenKind::Semicolon);

    SmallVector<LocalVariableDeclarationSyntax*> declarations;
    while (isLocalVariableDeclaration())
        declarations.push_back(&parseLocalVariableDeclaration());

    auto& spec = parsePropertySpec();
    Token optSemi = consumeIf(TokenKind::Semicolon);
    Token end = expect(TokenKind::EndPropertyKeyword);

    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.propertyDeclaration(attributes, keyword, name, portList, semi,
                                       declarations.copy(alloc), spec, optSemi, end, blockName);
}